

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.cpp
# Opt level: O0

void __thiscall TCPSocket::receiven(TCPSocket *this,char *buffer,int size)

{
  int iVar1;
  int local_20;
  int recvd;
  int left;
  int size_local;
  char *buffer_local;
  TCPSocket *this_local;
  
  local_20 = size;
  _left = buffer;
  do {
    iVar1 = receive(this,_left,local_20);
    local_20 = local_20 - iVar1;
    _left = _left + iVar1;
  } while (local_20 != 0);
  return;
}

Assistant:

void TCPSocket::receiven(char *buffer, int size) {
    int left = size;
    do{
        int recvd = receive(buffer, left);
        left -= recvd;
        buffer += recvd;
    }while(left != 0);
}